

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

SyntaxList<slang::syntax::SyntaxNode> * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::SyntaxList<slang::syntax::SyntaxNode>,slang::syntax::SyntaxList<slang::syntax::SyntaxNode>const&>
          (BumpAllocator *this,SyntaxList<slang::syntax::SyntaxNode> *args)

{
  SyntaxList<slang::syntax::SyntaxNode> *this_00;
  SyntaxList<slang::syntax::SyntaxNode> *args_local;
  BumpAllocator *this_local;
  
  this_00 = (SyntaxList<slang::syntax::SyntaxNode> *)allocate(this,0x30,8);
  slang::syntax::SyntaxList<slang::syntax::SyntaxNode>::SyntaxList(this_00,args);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }